

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_Record_R_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Set_Record_R_PDU::Set_Record_R_PDU(Set_Record_R_PDU *this)

{
  Set_Record_R_PDU *this_local;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  Reliability_Header::Reliability_Header(&this->super_Reliability_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Set_Record_R_PDU_0033a568;
  (this->super_Reliability_Header)._vptr_Reliability_Header =
       (_func_int **)&PTR__Set_Record_R_PDU_0033a5a8;
  this->m_ui32RqId = 0;
  this->m_ui32NumRecSets = 0;
  this->m_ui8Padding1 = '\0';
  this->m_ui16Padding = 0;
  this->m_ui32Padding = 0;
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::vector
            (&this->m_vRecs);
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '@';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolVersion =
       '\x06';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolFamily = '\n';
  return;
}

Assistant:

Set_Record_R_PDU::Set_Record_R_PDU() :
    m_ui32RqId( 0 ),
    m_ui32NumRecSets( 0 ),
    m_ui8Padding1( 0 ),
    m_ui16Padding( 0 ),
    m_ui32Padding( 0 )
{
    m_ui8PDUType = SetRecord_R_PDU_Type;
    m_ui16PDULength = SET_RECORD_R_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = SimulationManagementwithReliability;
}